

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

int uv_os_get_group(uv_group_t *grp,uv_uid_t gid)

{
  int iVar1;
  char *__buffer;
  size_t sVar2;
  char **ppcVar3;
  long lVar4;
  char *__s;
  size_t sVar5;
  long lVar6;
  long lVar7;
  group *result;
  group gp;
  group *local_60;
  size_t local_58;
  group local_50;
  
  if (grp == (uv_group_t *)0x0) {
    iVar1 = -0x16;
  }
  else {
    sVar5 = 2000;
    __buffer = (char *)uv__malloc(2000);
    iVar1 = -0xc;
    if (__buffer != (char *)0x0) {
      while( true ) {
        do {
          iVar1 = getgrgid_r(gid,&local_50,__buffer,sVar5,&local_60);
        } while (iVar1 == 4);
        if ((iVar1 != 0) || (local_60 == (group *)0x0)) {
          uv__free(__buffer);
        }
        if (iVar1 != 0x22) break;
        sVar5 = sVar5 * 2;
        __buffer = (char *)uv__malloc(sVar5);
        if (__buffer == (char *)0x0) {
          return -0xc;
        }
      }
      if (iVar1 != 0) {
        return -iVar1;
      }
      if (local_60 == (group *)0x0) {
        return -2;
      }
      sVar5 = strlen(local_50.gr_name);
      ppcVar3 = local_50.gr_mem;
      sVar5 = sVar5 + 1;
      lVar6 = 8;
      lVar7 = 0;
      __s = *local_50.gr_mem;
      while (__s != (char *)0x0) {
        sVar2 = strlen(__s);
        lVar6 = lVar6 + sVar2 + 9;
        lVar4 = lVar7 + 1;
        lVar7 = lVar7 + 1;
        __s = ppcVar3[lVar4];
      }
      ppcVar3 = (char **)uv__malloc(lVar6 + sVar5);
      if (ppcVar3 == (char **)0x0) {
        uv__free(__buffer);
        return -0xc;
      }
      grp->members = ppcVar3;
      ppcVar3[lVar7] = (char *)0x0;
      ppcVar3 = grp->members + lVar7 + 1;
      local_58 = sVar5;
      if (lVar7 != 0) {
        lVar4 = 0;
        do {
          grp->members[lVar4] = (char *)ppcVar3;
          strcpy((char *)ppcVar3,local_50.gr_mem[lVar4]);
          sVar5 = strlen((char *)ppcVar3);
          ppcVar3 = (char **)((long)ppcVar3 + sVar5 + 1);
          lVar4 = lVar4 + 1;
        } while (lVar7 != lVar4);
      }
      if (ppcVar3 == (char **)(lVar6 + (long)grp->members)) {
        grp->groupname = (char *)ppcVar3;
        memcpy(ppcVar3,local_50.gr_name,local_58);
        grp->gid = (ulong)local_50.gr_gid;
        uv__free(__buffer);
        return 0;
      }
      __assert_fail("gr_mem == (char*)grp->members + mem_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/core.c"
                    ,0x546,"int uv_os_get_group(uv_group_t *, uv_uid_t)");
    }
  }
  return iVar1;
}

Assistant:

int uv_os_get_group(uv_group_t* grp, uv_uid_t gid) {
#if defined(__ANDROID__) && __ANDROID_API__ < 24
  /* This function getgrgid_r() was added in Android N (level 24) */
  return UV_ENOSYS;
#else
  struct group gp;
  struct group* result;
  char* buf;
  char* gr_mem;
  size_t bufsize;
  size_t name_size;
  long members;
  size_t mem_size;
  int r;

  if (grp == NULL)
    return UV_EINVAL;

  /* Calling sysconf(_SC_GETGR_R_SIZE_MAX) would get the suggested size, but it
   * is frequently 1024 or 4096, so we can just use that directly. The pwent
   * will not usually be large. */
  for (bufsize = 2000;; bufsize *= 2) {
    buf = uv__malloc(bufsize);

    if (buf == NULL)
      return UV_ENOMEM;

    do
      r = getgrgid_r(gid, &gp, buf, bufsize, &result);
    while (r == EINTR);

    if (r != 0 || result == NULL)
      uv__free(buf);

    if (r != ERANGE)
      break;
  }

  if (r != 0)
    return UV__ERR(r);

  if (result == NULL)
    return UV_ENOENT;

  /* Allocate memory for the groupname and members. */
  name_size = strlen(gp.gr_name) + 1;
  members = 0;
  mem_size = sizeof(char*);
  for (r = 0; gp.gr_mem[r] != NULL; r++) {
    mem_size += strlen(gp.gr_mem[r]) + 1 + sizeof(char*);
    members++;
  }

  gr_mem = uv__malloc(name_size + mem_size);
  if (gr_mem == NULL) {
    uv__free(buf);
    return UV_ENOMEM;
  }

  /* Copy the members */
  grp->members = (char**) gr_mem;
  grp->members[members] = NULL;
  gr_mem = (char*) &grp->members[members + 1];
  for (r = 0; r < members; r++) {
    grp->members[r] = gr_mem;
    strcpy(gr_mem, gp.gr_mem[r]);
    gr_mem += strlen(gr_mem) + 1;
  }
  assert(gr_mem == (char*)grp->members + mem_size);

  /* Copy the groupname */
  grp->groupname = gr_mem;
  memcpy(grp->groupname, gp.gr_name, name_size);
  gr_mem += name_size;

  /* Copy the gid */
  grp->gid = gp.gr_gid;

  uv__free(buf);

  return 0;
#endif
}